

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::setStyle(QFont *this,Style style)

{
  QFontPrivate *pQVar1;
  
  if (((this->resolve_mask & 0x20) == 0) ||
     ((*(uint *)&(((this->d).d.ptr)->request).field_0x60 >> 0x1c & (StyleOblique|StyleItalic)) !=
      style)) {
    detach(this);
    pQVar1 = (this->d).d.ptr;
    *(ulong *)&(pQVar1->request).field_0x60 =
         *(ulong *)&(pQVar1->request).field_0x60 & 0xffffffffcfffffff |
         (ulong)((style & (StyleOblique|StyleItalic)) << 0x1c);
    *(byte *)&this->resolve_mask = (byte)this->resolve_mask | 0x20;
  }
  return;
}

Assistant:

void QFont::setStyle(Style style)
{
    if ((resolve_mask & QFont::StyleResolved) && d->request.style == style)
        return;

    detach();

    d->request.style = style;
    resolve_mask |= QFont::StyleResolved;
}